

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherInotify::watch(FileWatcherInotify *this)

{
  Thread *this_00;
  FileWatcherInotify *this_local;
  
  if (this->mThread == (Thread *)0x0) {
    this_00 = (Thread *)operator_new(0x18);
    Thread::Thread<efsw::FileWatcherInotify>
              (this_00,(offset_in_FileWatcherInotify_to_subr)run,(FileWatcherInotify *)0x0);
    this->mThread = this_00;
    (*this->mThread->_vptr_Thread[2])();
  }
  return;
}

Assistant:

void FileWatcherInotify::watch() {
	if ( NULL == mThread ) {
		mThread = new Thread( &FileWatcherInotify::run, this );
		mThread->launch();
	}
}